

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_dsc.c
# Opt level: O0

int dwarf_discr_entry_u(Dwarf_Dsc_Head dsh,Dwarf_Unsigned entrynum,Dwarf_Half *out_type,
                       Dwarf_Unsigned *out_discr_low,Dwarf_Unsigned *out_discr_high,
                       Dwarf_Error *error)

{
  int iVar1;
  undefined2 *puVar2;
  Dwarf_Unsigned local_58;
  size_t count;
  int dounsigned;
  int res;
  Dwarf_Dsc_Entry_s *dse;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *out_discr_high_local;
  Dwarf_Unsigned *out_discr_low_local;
  Dwarf_Half *out_type_local;
  Dwarf_Unsigned entrynum_local;
  Dwarf_Dsc_Head dsh_local;
  
  _dounsigned = 0;
  if (entrynum < dsh->dsh_count) {
    dse = (Dwarf_Dsc_Entry_s *)error;
    error_local = (Dwarf_Error *)out_discr_high;
    out_discr_high_local = out_discr_low;
    out_discr_low_local = (Dwarf_Unsigned *)out_type;
    out_type_local = (Dwarf_Half *)entrynum;
    entrynum_local = (Dwarf_Unsigned)dsh;
    if (dsh->dsh_set_unsigned == 0) {
      count._4_4_ = 0;
      count._0_4_ = 1;
      local_58 = dsh->dsh_count;
      iVar1 = get_dsc_leb_entries(dsh->dsh_debug,dsh->dsh_block,dsh->dsh_block_len,1,dsh->dsh_array,
                                  &local_58,error);
      if (iVar1 != 0) {
        return iVar1;
      }
      *(undefined4 *)(entrynum_local + 0x20) = 1;
      count._4_4_ = 0;
    }
    if (*(long *)(entrynum_local + 0x28) == 0) {
      _dwarf_error(*(Dwarf_Debug *)entrynum_local,(Dwarf_Error *)dse,0x161);
      dsh_local._4_4_ = 1;
    }
    else {
      puVar2 = (undefined2 *)(*(long *)(entrynum_local + 0x28) + (long)out_type_local * 0x28);
      *(undefined2 *)out_discr_low_local = *puVar2;
      *out_discr_high_local = *(Dwarf_Unsigned *)(puVar2 + 4);
      *error_local = *(Dwarf_Error *)(puVar2 + 8);
      dsh_local._4_4_ = 0;
    }
  }
  else {
    dsh_local._4_4_ = -1;
  }
  return dsh_local._4_4_;
}

Assistant:

int
dwarf_discr_entry_u(Dwarf_Dsc_Head  dsh ,
    Dwarf_Unsigned   entrynum,
    Dwarf_Half     * out_type,
    Dwarf_Unsigned * out_discr_low,
    Dwarf_Unsigned * out_discr_high,
    Dwarf_Error    * error)
{
    struct Dwarf_Dsc_Entry_s *dse = 0;

    (void)error;
    if (entrynum >= dsh->dsh_count) {
        return DW_DLV_NO_ENTRY;
    }
    if (!dsh->dsh_set_unsigned) {
        int res =0;
        int dounsigned = 1;
        size_t count = dsh->dsh_count;

        res = get_dsc_leb_entries(dsh->dsh_debug,
            dsh->dsh_block,
            dsh->dsh_block_len,
            dounsigned,
            dsh->dsh_array,
            &count,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        dsh->dsh_set_unsigned = TRUE;
    }
    if (!dsh->dsh_array) {
        _dwarf_error(dsh->dsh_debug, error, DW_DLE_DISCR_ARRAY_ERROR);
        return DW_DLV_ERROR;
    }
    dse = dsh->dsh_array + entrynum;
    *out_type       = dse->dsc_type;
    *out_discr_low  = dse->dsc_low_u;
    *out_discr_high = dse->dsc_high_u;
    return DW_DLV_OK;
}